

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

DescriptorFlags __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::GetItemSetter
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,ES5Array *arr,DynamicObject *instance,
          uint32 index,Var *setterValue,ScriptContext *requestContext)

{
  byte bVar1;
  Var pvVar2;
  bool bVar3;
  BOOL BVar4;
  IndexPropertyDescriptor *in_RAX;
  ES5Array *pEVar5;
  IndexPropertyDescriptor *local_38;
  IndexPropertyDescriptor *descriptor;
  
  local_38 = in_RAX;
  bVar3 = IndexPropertyDescriptorMap::TryGetReference((this->indexPropertyMap).ptr,index,&local_38);
  if (bVar3) {
    if ((local_38->Attributes & 8) != 0) {
      return None;
    }
    pEVar5 = VarTo<Js::ES5Array,Js::DynamicObject>(instance);
    BVar4 = HasDataItem(this,pEVar5,index);
    if (BVar4 == 0) {
      pvVar2 = (local_38->Setter).ptr;
      if (pvVar2 == (Var)0x0) {
        return None;
      }
      *setterValue = pvVar2;
      return Accessor;
    }
    bVar1 = local_38->Attributes;
  }
  else {
    pEVar5 = VarTo<Js::ES5Array,Js::DynamicObject>(instance);
    BVar4 = HasDataItem(this,pEVar5,index);
    if (BVar4 == 0) {
      return None;
    }
    bVar1 = this->dataItemAttributes;
  }
  return bVar1 & Writable | Data;
}

Assistant:

DescriptorFlags ES5ArrayTypeHandlerBase<T>::GetItemSetter(ES5Array* arr, DynamicObject* instance, uint32 index, Var* setterValue, ScriptContext* requestContext)
    {
        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                return None;
            }

            if (HasDataItem(VarTo<ES5Array>(instance), index))
            {
                // not a setter but shadows
                return (descriptor->Attributes & PropertyWritable) ? WritableData : Data;
            }
            else if (descriptor->Setter)
            {
                *setterValue = descriptor->Setter;
                return Accessor;
            }
        }
        else if (HasDataItem(VarTo<ES5Array>(instance), index))
        {
            return (GetDataItemAttributes() & PropertyWritable) ? WritableData : Data;
        }

        return None;
    }